

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

uint av1_refine_warped_mv
               (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
               BLOCK_SIZE bsize,int *pts0,int *pts_inref0,int total_samples,
               WARP_SEARCH_METHOD search_method,int num_iterations)

{
  int_mv *this_mv;
  uint uVar1;
  int mi_row;
  int mi_col;
  MB_MODE_INFO *pMVar2;
  BLOCK_SIZE bsize_00;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined7 in_register_00000009;
  size_t __n;
  ulong uVar7;
  warp_search_config *pwVar8;
  int16_t iVar9;
  int16_t iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  uint8_t local_176;
  byte local_175;
  uint local_174;
  MV local_170;
  uint local_16c;
  MB_MODE_INFO *local_168;
  WarpedMotionParams *local_160;
  undefined4 local_154;
  warp_search_config *local_150;
  WarpedMotionParams best_wm_params;
  int pts_inref [16];
  int pts [16];
  
  pMVar2 = *xd->mi;
  uVar1 = warp_search_info[search_method].num_neighbors;
  this_mv = pMVar2->mv;
  local_160 = &pMVar2->wm_params;
  best_wm_params.wmtype = (pMVar2->wm_params).wmtype;
  best_wm_params.invalid = (pMVar2->wm_params).invalid;
  best_wm_params._34_2_ = *(undefined2 *)&(pMVar2->wm_params).field_0x22;
  best_wm_params.wmmat._0_16_ = *(undefined1 (*) [16])(pMVar2->wm_params).wmmat;
  best_wm_params.wmmat[4]._0_2_ = (undefined2)(pMVar2->wm_params).wmmat[4];
  best_wm_params.wmmat[4]._2_2_ = *(undefined2 *)((long)(pMVar2->wm_params).wmmat + 0x12);
  best_wm_params.wmmat[5]._0_2_ = (undefined2)(pMVar2->wm_params).wmmat[5];
  best_wm_params.wmmat[5]._2_2_ = *(undefined2 *)((long)(pMVar2->wm_params).wmmat + 0x16);
  best_wm_params.alpha = (pMVar2->wm_params).alpha;
  best_wm_params.beta = (pMVar2->wm_params).beta;
  best_wm_params.gamma = (pMVar2->wm_params).gamma;
  best_wm_params.delta = (pMVar2->wm_params).delta;
  local_176 = pMVar2->num_proj_ref;
  iVar6 = ms_params->allow_hp;
  local_154 = (undefined4)CONCAT71(in_register_00000009,bsize);
  local_168 = pMVar2;
  local_16c = compute_motion_cost(xd,cm,ms_params,bsize,&this_mv->as_mv);
  if (0 < num_iterations) {
    pwVar8 = warp_search_info + search_method;
    mi_row = xd->mi_row;
    mi_col = xd->mi_col;
    __n = (long)(total_samples * 2) << 2;
    local_175 = 0xff;
    auVar12 = ZEXT116(iVar6 == 0);
    iVar6 = 0;
    local_150 = pwVar8;
    do {
      if ((int)uVar1 < 1) break;
      local_174 = 0xffffffff;
      uVar7 = 0;
      do {
        if ((local_175 >> ((uint)uVar7 & 0x1f) & 1) != 0) {
          auVar10 = psllw(ZEXT416((uint)pwVar8->neighbors[uVar7]),auVar12);
          iVar9 = auVar10._0_2_ + (this_mv->as_mv).row;
          iVar11 = auVar10._2_2_ + (this_mv->as_mv).col;
          if (((((ms_params->mv_limits).col_min <= (int)iVar11) &&
               ((int)iVar11 <= (ms_params->mv_limits).col_max)) &&
              ((ms_params->mv_limits).row_min <= (int)iVar9)) &&
             ((int)iVar9 <= (ms_params->mv_limits).row_max)) {
            local_170.row = iVar9;
            local_170.col = iVar11;
            memcpy(pts,pts0,__n);
            memcpy(pts_inref,pts_inref0,__n);
            bsize_00 = (BLOCK_SIZE)local_154;
            if (total_samples < 2) {
              bVar3 = local_168->num_proj_ref;
            }
            else {
              bVar3 = av1_selectSamples(&local_170,pts,pts_inref,total_samples,(BLOCK_SIZE)local_154
                                       );
              local_168->num_proj_ref = bVar3;
              iVar11 = local_170.col;
              iVar9 = local_170.row;
            }
            iVar4 = av1_find_projection((uint)bVar3,pts,pts_inref,bsize_00,(int)iVar9,(int)iVar11,
                                        local_160,mi_row,mi_col);
            pwVar8 = local_150;
            if ((iVar4 == 0) &&
               (uVar5 = compute_motion_cost(xd,cm,ms_params,bsize_00,&local_170), pwVar8 = local_150
               , uVar5 < local_16c)) {
              best_wm_params.wmtype = local_160->wmtype;
              best_wm_params.invalid = local_160->invalid;
              best_wm_params._34_2_ = *(undefined2 *)&local_160->field_0x22;
              best_wm_params.wmmat._0_16_ = *(undefined1 (*) [16])local_160->wmmat;
              best_wm_params.wmmat[4]._0_2_ = (undefined2)local_160->wmmat[4];
              best_wm_params.wmmat[4]._2_2_ = *(undefined2 *)((long)local_160->wmmat + 0x12);
              best_wm_params.wmmat[5]._0_2_ = (undefined2)local_160->wmmat[5];
              best_wm_params.wmmat[5]._2_2_ = *(undefined2 *)((long)local_160->wmmat + 0x16);
              best_wm_params.alpha = local_160->alpha;
              best_wm_params.beta = local_160->beta;
              best_wm_params.gamma = local_160->gamma;
              best_wm_params.delta = local_160->delta;
              local_176 = local_168->num_proj_ref;
              local_174 = (uint)uVar7;
              local_16c = uVar5;
            }
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      if ((int)local_174 < 0) {
        if (local_174 == 0xffffffff) break;
      }
      else {
        auVar10 = psllw(ZEXT416((uint)pwVar8->neighbors[local_174]),auVar12);
        (this_mv->as_mv).row = (this_mv->as_mv).row + auVar10._0_2_;
        pMVar2->mv[0].as_mv.col = (this_mv->as_mv).col + auVar10._2_2_;
        local_175 = pwVar8->neighbor_mask[local_174];
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != num_iterations);
  }
  local_160->wmtype = best_wm_params.wmtype;
  local_160->invalid = best_wm_params.invalid;
  *(undefined2 *)&local_160->field_0x22 = best_wm_params._34_2_;
  *(ulong *)(local_160->wmmat + 4) =
       CONCAT26(best_wm_params.wmmat[5]._2_2_,
                CONCAT24((undefined2)best_wm_params.wmmat[5],
                         CONCAT22(best_wm_params.wmmat[4]._2_2_,(undefined2)best_wm_params.wmmat[4])
                        ));
  local_160->alpha = best_wm_params.alpha;
  local_160->beta = best_wm_params.beta;
  local_160->gamma = best_wm_params.gamma;
  local_160->delta = best_wm_params.delta;
  *(undefined8 *)local_160->wmmat = best_wm_params.wmmat._0_8_;
  *(undefined8 *)(local_160->wmmat + 2) = best_wm_params.wmmat._8_8_;
  local_168->num_proj_ref = local_176;
  return local_16c;
}

Assistant:

unsigned int av1_refine_warped_mv(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                                  const SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                                  BLOCK_SIZE bsize, const int *pts0,
                                  const int *pts_inref0, int total_samples,
                                  WARP_SEARCH_METHOD search_method,
                                  int num_iterations) {
  MB_MODE_INFO *mbmi = xd->mi[0];

  const MV *neighbors = warp_search_info[search_method].neighbors;
  const int num_neighbors = warp_search_info[search_method].num_neighbors;
  const uint8_t *neighbor_mask = warp_search_info[search_method].neighbor_mask;

  MV *best_mv = &mbmi->mv[0].as_mv;

  WarpedMotionParams best_wm_params = mbmi->wm_params;
  int best_num_proj_ref = mbmi->num_proj_ref;
  unsigned int bestmse;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;

  const int mv_shift = ms_params->allow_hp ? 0 : 1;

  // Calculate the center position's error
  assert(av1_is_subpelmv_in_range(mv_limits, *best_mv));
  bestmse = compute_motion_cost(xd, cm, ms_params, bsize, best_mv);

  // MV search
  int pts[SAMPLES_ARRAY_SIZE], pts_inref[SAMPLES_ARRAY_SIZE];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // First step always scans all neighbors
  uint8_t valid_neighbors = UINT8_MAX;

  for (int ite = 0; ite < num_iterations; ++ite) {
    int best_idx = -1;

    for (int idx = 0; idx < num_neighbors; ++idx) {
      if ((valid_neighbors & (1 << idx)) == 0) {
        continue;
      }

      unsigned int thismse;

      MV this_mv = { best_mv->row + neighbors[idx].row * (1 << mv_shift),
                     best_mv->col + neighbors[idx].col * (1 << mv_shift) };
      if (av1_is_subpelmv_in_range(mv_limits, this_mv)) {
        memcpy(pts, pts0, total_samples * 2 * sizeof(*pts0));
        memcpy(pts_inref, pts_inref0, total_samples * 2 * sizeof(*pts_inref0));
        if (total_samples > 1) {
          mbmi->num_proj_ref =
              av1_selectSamples(&this_mv, pts, pts_inref, total_samples, bsize);
        }

        if (!av1_find_projection(mbmi->num_proj_ref, pts, pts_inref, bsize,
                                 this_mv.row, this_mv.col, &mbmi->wm_params,
                                 mi_row, mi_col)) {
          thismse = compute_motion_cost(xd, cm, ms_params, bsize, &this_mv);

          if (thismse < bestmse) {
            best_idx = idx;
            best_wm_params = mbmi->wm_params;
            best_num_proj_ref = mbmi->num_proj_ref;
            bestmse = thismse;
          }
        }
      }
    }

    if (best_idx == -1) break;

    if (best_idx >= 0) {
      best_mv->row += neighbors[best_idx].row * (1 << mv_shift);
      best_mv->col += neighbors[best_idx].col * (1 << mv_shift);
      valid_neighbors = neighbor_mask[best_idx];
    }
  }

  mbmi->wm_params = best_wm_params;
  mbmi->num_proj_ref = best_num_proj_ref;
  return bestmse;
}